

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O2

IEnumerableCore<linq::SkipState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_int_&>_>
* __thiscall
linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::Skip
          (IEnumerableCore<linq::SkipState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_int_&>_>
           *__return_storage_ptr__,
          IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> *this
          ,size_t count)

{
  SkipState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_int_&> SStack_58;
  
  SkipState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_int_&>::SkipState
            (&SStack_58,&this->source,count);
  SkipState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_int_&>::SkipState
            (&__return_storage_ptr__->source,&SStack_58);
  SkipState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_int_&>::~SkipState
            (&SStack_58);
  return __return_storage_ptr__;
}

Assistant:

auto Skip(size_t count) 
		{ 
			return IEnumerableCore<SkipState<S, T>>(
				SkipState<S, T>(std::move(source), count)
			);
		}